

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O1

void __thiscall tst_helpers_connect::rejectOneSenderDestroyed(tst_helpers_connect *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> *pQVar3;
  PromiseResolver<void> PVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> this_00;
  char cVar5;
  bool bVar6;
  Object *this_01;
  QObject *pQVar7;
  int *piVar8;
  QEvent *this_02;
  char *pcVar9;
  char *pcVar10;
  PromiseDataBase<void,_void_()> *this_03;
  PromiseData<int> *this_04;
  char *reject;
  QSharedData *pQVar11;
  QSharedData *pQVar12;
  bool local_109;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_108;
  PromiseResolver<int> resolver_1;
  bool local_f1;
  _Any_data local_f0;
  undefined **local_e0;
  PromiseData<int> *local_d8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_d0;
  QPromise<int> local_c8;
  PromiseResolver<void> resolver;
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> p;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  Object *sender;
  
  this_01 = (Object *)operator_new(0x18);
  *(undefined8 *)this_01 = 0;
  *(undefined8 *)&this_01->field_0x8 = 0;
  *(undefined8 *)&this_01->m_connections = 0;
  QObject::QObject((QObject *)this_01,(QObject *)0x0);
  *(undefined ***)this_01 = &PTR_metaObject_0012acd0;
  this_01->m_connections = 0;
  sender = this_01;
  pQVar7 = (QObject *)QThread::currentThread();
  if (pQVar7 == (QObject *)0x0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7);
  }
  if (piVar8 != (int *)0x0) {
    if (((pQVar7 != (QObject *)0x0) && (piVar8[1] != 0)) &&
       (cVar5 = QThread::isFinished(), cVar5 == '\0')) {
      if (piVar8[1] == 0) {
        pQVar7 = (QObject *)(QThread *)0x0;
      }
      pQVar7 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar7);
      if ((pQVar7 != (QObject *)0x0) || (cVar5 = QCoreApplication::closingDown(), cVar5 == '\0')) {
        this_02 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(this_02,None);
        *(undefined ***)this_02 = &PTR__Event_0012a470;
        *(Object ***)(this_02 + 0x10) = &sender;
        QCoreApplication::postEvent(pQVar7,this_02,0);
      }
    }
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      operator_delete(piVar8);
    }
  }
  QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
            ((Object *)&p,(offset_in_Object_to_subr)sender);
  this_00 = p.super_QPromiseBase<int>.m_d;
  bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_f0._M_pod_data[0] = bVar6;
  resolver.m_d.d._0_1_ = 1;
  pcVar9 = QTest::toString<bool>((bool *)local_f0._M_pod_data);
  pcVar10 = QTest::toString<bool>((bool *)&resolver);
  reject = "p.isPending()";
  cVar5 = QTest::compare_helper
                    (bVar6,"Compared values are not the same",pcVar9,pcVar10,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x8b);
  if (cVar5 != '\0') {
    local_109 = false;
    LOCK();
    pQVar11 = &((this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    this_03 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
    this_03->_vptr_PromiseDataBase = (_func_int **)0x0;
    *(undefined8 *)&this_03->super_QSharedData = 0;
    (this_03->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_03->m_catchers).d.size = 0;
    (this_03->m_handlers).d.size = 0;
    (this_03->m_catchers).d.d = (Data *)0x0;
    (this_03->m_handlers).d.d = (Data *)0x0;
    (this_03->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
    *(undefined8 *)&this_03->m_lock = 0;
    *(undefined8 *)&this_03->m_settled = 0;
    (this_03->m_error).m_data._M_exception_object = (void *)0x0;
    this_03->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012a7e0;
    QReadWriteLock::QReadWriteLock(&this_03->m_lock,0);
    this_03->m_settled = false;
    (this_03->m_handlers).d.d = (Data *)0x0;
    (this_03->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
    (this_03->m_handlers).d.size = 0;
    (this_03->m_catchers).d.d = (Data *)0x0;
    (this_03->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_03->m_catchers).d.size = 0;
    (this_03->m_error).m_data._M_exception_object = (void *)0x0;
    this_03->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012a768;
    LOCK();
    (this_03->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_03->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (this_03->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_03->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar11 = &this_03->super_QSharedData;
    local_f0._M_unused._M_object = &PTR__QPromiseBase_0012a730;
    local_f0._8_8_ = this_03;
    QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_f0);
    local_f0._M_unused._M_object = &PTR__QPromiseBase_0012a6a0;
    if ((PromiseDataBase<void,_void_()> *)local_f0._8_8_ != (PromiseDataBase<void,_void_()> *)0x0) {
      LOCK();
      pQVar1 = (QSharedData *)(local_f0._8_8_ + 8);
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         ((PromiseDataBase<void,_void_()> *)local_f0._8_8_ != (PromiseDataBase<void,_void_()> *)0x0)
         ) {
        (**(code **)(*(long *)local_f0._8_8_ + 8))();
      }
    }
    PVar4.m_d.d = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = operator_new(0x18);
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
    local_58._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
      UNLOCK();
    }
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
    ((long)local_58._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
    if (PVar4.m_d.d == (Data *)0x0) {
      pcStack_40 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_manager;
    }
    else {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
      UNLOCK();
      pcStack_40 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_manager;
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
      UNLOCK();
    }
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_78._M_unused._M_object = operator_new(0x18);
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
    local_78._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
      UNLOCK();
    }
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
    ((long)local_78._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
    if (PVar4.m_d.d == (Data *)0x0) {
      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
      ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&local_109;
      pcStack_60 = std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_manager;
    }
    else {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
      UNLOCK();
      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
      ((long)local_78._M_unused._0_8_ + 0x10))->d = (Data *)&local_109;
      pcStack_60 = std::
                   _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_manager;
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver.m_d.d,0x10);
      }
    }
    bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar6) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
    }
    pQVar1 = &((this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    LOCK();
    pQVar12 = &((this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    this_04 = (PromiseData<int> *)operator_new(0x68);
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(this_04->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (this_04->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
    *(undefined8 *)&(this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (this_04->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)&PTR__PromiseDataBase_0012aae0;
    QReadWriteLock::QReadWriteLock
              (&(this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (this_04->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)&PTR__PromiseData_0012aa78;
    (this_04->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_04->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LOCK();
    pQVar12 = &(this_04->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    pQVar12 = &(this_04->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar12 = &(this_04->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    local_c8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012aa40;
    local_c8.super_QPromiseBase<int>.m_d.d = this_04;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,&local_c8);
    local_c8.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012a700;
    if (local_c8.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar2 = &((local_c8.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (local_c8.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
        (*((local_c8.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
          ._vptr_PromiseDataBase[1])();
      }
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_108 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_d0 = resolver_1.m_d.d;
    local_f0._M_unused._M_object = (void *)resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_f0._8_8_ = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
    }
    local_d8 = this_00.d;
    LOCK();
    pQVar2 = &((this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_e0 = &PTR__QPromiseBase_0012aa40;
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         operator_new(0x20);
    *(void **)resolver.m_d.d = local_f0._M_unused._M_object;
    if ((Data *)local_f0._M_unused._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_f0._M_unused._0_8_ = *local_f0._M_unused._M_object + 1;
      UNLOCK();
    }
    ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)local_f0._8_8_;
    if ((Data *)local_f0._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_f0._8_8_ = *(int *)local_f0._8_8_ + 1;
      UNLOCK();
    }
    *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0012a700;
    ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<void> *)local_d8;
    if (local_d8 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar3 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> *)
               &(local_d8->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      *(int *)&pQVar3->d = *(int *)&pQVar3->d + 1;
      UNLOCK();
    }
    *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0012aa40;
    local_e0 = &PTR__QPromiseBase_0012a700;
    if (local_d8 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar3 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> *)
               &(local_d8->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      *(int *)&pQVar3->d = *(int *)&pQVar3->d + -1;
      UNLOCK();
      if ((*(int *)&pQVar3->d == 0) && (local_d8 != (PromiseData<int> *)0x0)) {
        (*(local_d8->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    if ((Data *)local_f0._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_f0._8_8_ = *(int *)local_f0._8_8_ + -1;
      UNLOCK();
      if ((*(int *)local_f0._8_8_ == 0) && ((Data *)local_f0._8_8_ != (Data *)0x0)) {
        operator_delete((void *)local_f0._8_8_,0x10);
      }
    }
    if ((Data *)local_f0._M_unused._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_f0._M_unused._0_8_ = *local_f0._M_unused._M_object + -1;
      UNLOCK();
      if ((*local_f0._M_unused._M_object == 0) && ((Data *)local_f0._M_unused._0_8_ != (Data *)0x0))
      {
        operator_delete(local_f0._M_unused._M_object,0x10);
      }
    }
    QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
              (this_03,(function<void_()> *)&resolver);
    std::
    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
    ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
    QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_f0,
               (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_108,
               (QPromiseResolve<int> *)&local_d0,(QPromiseReject<void> *)reject);
    QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
              (this_03,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_f0);
    if (local_e0 != (undefined **)0x0) {
      (*(code *)local_e0)(&local_f0,&local_f0,__destroy_functor);
    }
    if (local_d0.d != (Data *)0x0) {
      LOCK();
      ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
      ._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if (((__int_type)
           ((local_d0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
         (local_d0.d != (Data *)0x0)) {
        operator_delete(local_d0.d,0x10);
      }
    }
    if (local_108.d != (Data *)0x0) {
      LOCK();
      ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_108.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_108.d != (Data *)0x0)) {
        operator_delete(local_108.d,0x10);
      }
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver_1.m_d.d,0x10);
      }
    }
    bVar6 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_03);
    if (!bVar6) {
      QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_03);
    }
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*((this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                (this_00.d);
    }
    LOCK();
    (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*this_03->_vptr_PromiseDataBase[1])(this_03);
    }
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*((this_00.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                (this_00.d);
    }
    bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      ((PromiseDataBase<int,_void_(const_int_&)> *)this_04);
    while (bVar6 != false) {
      QCoreApplication::processEvents();
      QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
      bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        ((PromiseDataBase<int,_void_(const_int_&)> *)this_04);
    }
    LOCK();
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*(this_04->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_04)
      ;
    }
    LOCK();
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*(this_04->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_04)
      ;
    }
    bVar6 = local_109;
    local_f1 = local_109;
    local_c8.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_c8.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
    pcVar9 = QTest::toString<bool>(&local_f1);
    pcVar10 = QTest::toString<bool>((bool *)&local_c8);
    QTest::compare_helper
              (bVar6,"Compared values are not the same",pcVar9,pcVar10,
               "waitForRejected<QtPromise::QPromiseContextException>(p)","true",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
               ,0x8c);
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012a700;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar11 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_helpers_connect::rejectOneSenderDestroyed()
{
    auto sender = new Object{};
    QtPromisePrivate::qtpromise_defer([&]() {
        sender->deleteLater();
    });

    auto p = QtPromise::connect(sender, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForRejected<QtPromise::QPromiseContextException>(p), true);
}